

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coincontrol.cpp
# Opt level: O1

optional<unsigned_int> __thiscall
wallet::CCoinControl::GetSequence(CCoinControl *this,COutPoint *outpoint)

{
  long lVar1;
  const_iterator cVar2;
  _Optional_payload_base<unsigned_int> _Var3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  cVar2 = std::
          _Rb_tree<COutPoint,_std::pair<const_COutPoint,_wallet::PreselectedInput>,_std::_Select1st<std::pair<const_COutPoint,_wallet::PreselectedInput>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_wallet::PreselectedInput>_>_>
          ::find(&(this->m_selected)._M_t,outpoint);
  if ((_Rb_tree_header *)cVar2._M_node == &(this->m_selected)._M_t._M_impl.super__Rb_tree_header) {
    _Var3._M_payload = (_Storage<unsigned_int,_true>)0x0;
    _Var3._M_engaged = false;
    _Var3._5_3_ = 0;
  }
  else {
    _Var3 = (_Optional_payload_base<unsigned_int>)cVar2._M_node[4]._M_parent;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (optional<unsigned_int>)_Var3;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<uint32_t> CCoinControl::GetSequence(const COutPoint& outpoint) const
{
    const auto it = m_selected.find(outpoint);
    return it != m_selected.end() ? it->second.GetSequence() : std::nullopt;
}